

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_DUPM(DisasContext_conflict1 *s,arg_DUPM *a)

{
  _Bool _Var1;
  uint32_t immn;
  uint32_t imms;
  uint32_t immr;
  uint64_t local_28;
  uint64_t imm;
  arg_DUPM *a_local;
  DisasContext_conflict1 *s_local;
  
  imm = (uint64_t)a;
  a_local = (arg_DUPM *)s;
  immn = extract32(a->dbm,0xc,1);
  imms = extract32(*(uint32_t *)imm,0,6);
  immr = extract32(*(uint32_t *)imm,6,6);
  _Var1 = logic_imm_decode_wmask_aarch64(&local_28,immn,imms,immr);
  if (_Var1) {
    _Var1 = sve_access_check_aarch64((DisasContext_conflict1 *)a_local);
    if (_Var1) {
      do_dupi_z((DisasContext_conflict1 *)a_local,*(int *)(imm + 4),local_28);
    }
    s_local._7_1_ = true;
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_DUPM(DisasContext *s, arg_DUPM *a)
{
    uint64_t imm;
    if (!logic_imm_decode_wmask(&imm, extract32(a->dbm, 12, 1),
                                extract32(a->dbm, 0, 6),
                                extract32(a->dbm, 6, 6))) {
        return false;
    }
    if (sve_access_check(s)) {
        do_dupi_z(s, a->rd, imm);
    }
    return true;
}